

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O2

shared_ptr<spdlog::logger>
spdlog::stderr_logger_st<spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>>
          (string *logger_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<spdlog::logger> sVar2;
  pointer local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,in_RSI);
  async_factory_impl<(spdlog::async_overflow_policy)0>::
  create<spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>>
            ((async_factory_impl<(spdlog::async_overflow_policy)0> *)&local_48,&local_30);
  _Var1._M_pi = a_Stack_40[0]._M_pi;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (logger_name->_M_dataplus)._M_p = local_48;
  logger_name->_M_string_length = (size_type)_Var1._M_pi;
  local_48 = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  std::__cxx11::string::~string((string *)&local_30);
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)logger_name;
  return (shared_ptr<spdlog::logger>)
         sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stderr_logger_st(const std::string &logger_name) {
    return Factory::template create<sinks::stderr_sink_st>(logger_name);
}